

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_language.cpp
# Opt level: O2

GrammarPtr __thiscall Omega_h::build_grammar(Omega_h *this,Language *language)

{
  pointer pTVar1;
  pointer pPVar2;
  key_type *pkVar3;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var4;
  uint *puVar5;
  size_type sVar6;
  mapped_type *pmVar7;
  reference pvVar8;
  _Base_ptr p_Var9;
  ostream *poVar10;
  ParserFail *this_00;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *init_val;
  __shared_count<(__gnu_cxx::_Lock_policy)2> extraout_RDX;
  vector<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_> *__range1;
  key_type *__x;
  uint uVar11;
  pointer pPVar12;
  Token *token;
  pointer __k;
  GrammarPtr GVar13;
  uint local_26c;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
  symbol_map;
  Production gprod;
  Grammar out;
  string local_1d8;
  stringstream ss;
  int iStack_1b4;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  ostream local_1a8 [376];
  
  symbol_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &symbol_map._M_t._M_impl.super__Rb_tree_header._M_header;
  symbol_map._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  symbol_map._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  symbol_map._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  pTVar1 = (language->tokens).
           super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>.
           _M_impl.super__Vector_impl_data._M_finish;
  uVar11 = 0;
  symbol_map._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       symbol_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
  for (__k = (language->tokens).
             super__Vector_base<Omega_h::Language::Token,_std::allocator<Omega_h::Language::Token>_>
             ._M_impl.super__Vector_impl_data._M_start; __k != pTVar1; __k = __k + 1) {
    puVar5 = (uint *)std::
                     map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                     ::operator[](&symbol_map,&__k->name);
    *puVar5 = uVar11;
    uVar11 = uVar11 + 1;
  }
  pPVar2 = (language->productions).
           super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  local_26c = uVar11;
  for (pPVar12 = (language->productions).
                 super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
                 ._M_impl.super__Vector_impl_data._M_start; pPVar12 != pPVar2; pPVar12 = pPVar12 + 1
      ) {
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::count(&symbol_map,&pPVar12->lhs);
    if (sVar6 == 0) {
      puVar5 = (uint *)std::
                       map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                       ::operator[](&symbol_map,&pPVar12->lhs);
      *puVar5 = local_26c;
      local_26c = local_26c + 1;
    }
  }
  init_val = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&out.productions;
  out.symbol_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  out.symbol_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  out.productions.
  super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  out.symbol_names.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  out.productions.
  super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  out.productions.
  super__Vector_base<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  out.nsymbols = local_26c;
  pPVar12 = (language->productions).
            super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pPVar2 = (language->productions).
           super__Vector_base<Omega_h::Language::Production,_std::allocator<Omega_h::Language::Production>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  out.nterminals = uVar11;
  while( true ) {
    if (pPVar12 == pPVar2) {
      _ss = local_1a8;
      _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_1a8[0] = (ostream)0x0;
      make_vector<std::__cxx11::string>
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)&gprod,(Omega_h *)(ulong)local_26c,(int)&ss,init_val);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::_M_move_assign(&out.symbol_names,&gprod);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&gprod);
      std::__cxx11::string::~string((string *)&ss);
      for (p_Var9 = symbol_map._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
          (_Rb_tree_header *)p_Var9 != &symbol_map._M_t._M_impl.super__Rb_tree_header;
          p_Var9 = (_Base_ptr)std::_Rb_tree_increment(p_Var9)) {
        pvVar8 = at<std::__cxx11::string>(&out.symbol_names,p_Var9[2]._M_color);
        std::__cxx11::string::_M_assign((string *)pvVar8);
      }
      add_end_terminal(&out);
      add_accept_production(&out);
      std::make_shared<Omega_h::Grammar,Omega_h::Grammar>((Grammar *)&ss);
      _Var4._M_pi = _Stack_1b0._M_pi;
      _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      *(ostream **)this = _ss;
      *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var4._M_pi;
      _ss = 0;
      iStack_1b4 = 0;
      std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&_Stack_1b0);
      Grammar::~Grammar(&out);
      std::
      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
      ::~_Rb_tree(&symbol_map._M_t);
      GVar13.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
      _M_pi = extraout_RDX._M_pi;
      GVar13.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)this;
      return (GrammarPtr)
             GVar13.super___shared_ptr<const_Omega_h::Grammar,_(__gnu_cxx::_Lock_policy)2>;
    }
    gprod.rhs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    gprod.rhs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = (pointer)0x0;
    gprod.rhs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    sVar6 = std::
            map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
            ::count(&symbol_map,&pPVar12->lhs);
    if (sVar6 == 0) break;
    pmVar7 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
             ::operator[](&symbol_map,&pPVar12->lhs);
    gprod.lhs = *pmVar7;
    pkVar3 = (pPVar12->rhs).
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ._M_impl.super__Vector_impl_data._M_finish;
    for (__x = (pPVar12->rhs).
               super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start; __x != pkVar3; __x = __x + 1) {
      sVar6 = std::
              map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
              ::count(&symbol_map,__x);
      if (sVar6 == 0) {
        std::__cxx11::stringstream::stringstream((stringstream *)&ss);
        poVar10 = std::operator<<(local_1a8,"RHS entry \"");
        poVar10 = std::operator<<(poVar10,(string *)__x);
        std::operator<<(poVar10,"\" is neither a nonterminal (LHS of a production) nor a token!\n");
        this_00 = (ParserFail *)__cxa_allocate_exception(0x10);
        std::__cxx11::stringbuf::str();
        ParserFail::ParserFail(this_00,&local_1d8);
        __cxa_throw(this_00,&ParserFail::typeinfo,std::invalid_argument::~invalid_argument);
      }
      pmVar7 = std::
               map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
               ::operator[](&symbol_map,__x);
      std::vector<int,_std::allocator<int>_>::push_back(&gprod.rhs,pmVar7);
    }
    std::vector<Omega_h::Grammar::Production,_std::allocator<Omega_h::Grammar::Production>_>::
    emplace_back<Omega_h::Grammar::Production>(&out.productions,&gprod);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&gprod.rhs.super__Vector_base<int,_std::allocator<int>_>);
    pPVar12 = pPVar12 + 1;
  }
  fail("assertion %s failed at %s +%d\n","symbol_map.count(lang_prod.lhs)",
       "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_language.cpp"
       ,0x1f);
}

Assistant:

GrammarPtr build_grammar(Language const& language) {
  std::map<std::string, int> symbol_map;
  int nterminals = 0;
  for (auto& token : language.tokens) {
    symbol_map[token.name] = nterminals++;
  }
  int nsymbols = nterminals;
  for (auto& production : language.productions) {
    if (symbol_map.count(production.lhs)) continue;
    symbol_map[production.lhs] = nsymbols++;
  }
  Grammar out;
  out.nsymbols = nsymbols;
  out.nterminals = nterminals;
  for (auto& lang_prod : language.productions) {
    Grammar::Production gprod;
    OMEGA_H_CHECK(symbol_map.count(lang_prod.lhs));
    gprod.lhs = symbol_map[lang_prod.lhs];
    for (auto& lang_symb : lang_prod.rhs) {
      if (!symbol_map.count(lang_symb)) {
        std::stringstream ss;
        ss << "RHS entry \"" << lang_symb
           << "\" is neither a nonterminal (LHS of a production) nor a "
              "token!\n";
        throw ParserFail(ss.str());
      }
      gprod.rhs.push_back(symbol_map[lang_symb]);
    }
    out.productions.emplace_back(std::move(gprod));
  }
  out.symbol_names = make_vector<std::string>(nsymbols);
  for (auto& pair : symbol_map) {
    at(out.symbol_names, pair.second) = pair.first;
  }
  add_end_terminal(out);
  add_accept_production(out);
  return std::make_shared<Grammar>(std::move(out));
}